

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O1

bool __thiscall
HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int>::
insert<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int&>
          (HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int>
           *this,pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar> *args,int *args_1)

{
  byte bVar1;
  u8 uVar2;
  int iVar3;
  long lVar4;
  pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar> pVar5;
  bool bVar6;
  ulong uVar7;
  u8 meta;
  u64 pos;
  u64 maxPos;
  u64 startPos;
  u8 local_31;
  ulong local_30;
  HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
  local_28;
  ulong local_18;
  ulong local_10;
  
  local_28.key_ = *args;
  local_28.value_ = *args_1;
  bVar6 = HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::
          findPosition((HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
                        *)this,&local_28.key_,&local_31,&local_10,&local_18,&local_30);
  if (bVar6) {
    bVar6 = false;
  }
  else if ((*(ulong *)(this + 0x20) == *(long *)(this + 0x10) * 7 + 7U >> 3) ||
          (local_30 == local_18)) {
    HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::
    growTable((HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
               *)this);
    bVar6 = insert<HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int>>
                      (this,&local_28);
  }
  else {
    lVar4 = *(long *)this;
    *(ulong *)(this + 0x20) = *(ulong *)(this + 0x20) + 1;
    do {
      pVar5 = local_28.key_;
      bVar1 = *(byte *)(*(long *)(this + 8) + local_30);
      if (-1 < (char)bVar1) {
        *(u8 *)(*(long *)(this + 8) + local_30) = local_31;
        *(int *)(lVar4 + 8 + local_30 * 0xc) = local_28.value_;
        *(pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar> *)(lVar4 + local_30 * 0xc)
             = local_28.key_;
        goto LAB_002718d7;
      }
      uVar7 = (ulong)((int)local_30 - (uint)bVar1 & 0x7f);
      if (uVar7 < (local_30 - local_10 & *(ulong *)(this + 0x10))) {
        local_28.key_.second = *(CliqueVar *)(lVar4 + 4 + local_30 * 0xc);
        local_28.key_.first = *(CliqueVar *)(lVar4 + local_30 * 0xc);
        iVar3 = *(int *)(lVar4 + 8 + local_30 * 0xc);
        *(pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar> *)(lVar4 + local_30 * 0xc)
             = pVar5;
        *(int *)(lVar4 + 8 + local_30 * 0xc) = local_28.value_;
        uVar2 = *(u8 *)(*(long *)(this + 8) + local_30);
        *(u8 *)(*(long *)(this + 8) + local_30) = local_31;
        local_10 = local_30 - uVar7 & *(ulong *)(this + 0x10);
        local_18 = local_10 + 0x7f & *(ulong *)(this + 0x10);
        local_31 = uVar2;
        local_28.value_ = iVar3;
      }
      local_30 = local_30 + 1 & *(ulong *)(this + 0x10);
    } while (local_30 != local_18);
    HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::
    growTable((HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
               *)this);
    insert<HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int>>
              (this,&local_28);
LAB_002718d7:
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool insert(Args&&... args) {
    Entry entry(std::forward<Args>(args)...);

    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(entry.key(), meta, startPos, maxPos, pos)) return false;

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return insert(std::move(entry));
    }

    using std::swap;
    Entry* entryArray = entries.get();
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return true;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return true;
  }